

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O0

ssize_t read_abi_cxx11_(int __fd,void *__buf,size_t __nbytes)

{
  file *this;
  int __fd_00;
  ssize_t sVar1;
  allocator *__nbytes_00;
  undefined4 in_register_0000003c;
  string *this_00;
  size_t offset;
  size_t n;
  string *buffer;
  bool local_79;
  allocator *local_40;
  allocator local_1a;
  undefined1 local_19;
  allocator *local_18;
  file *local_10;
  string *local_8;
  
  this_00 = (string *)CONCAT44(in_register_0000003c,__fd);
  local_19 = 0;
  __nbytes_00 = &local_1a;
  local_18 = (allocator *)__nbytes;
  local_10 = (file *)__buf;
  local_8 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,__nbytes,'\0',__nbytes_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  local_40 = (allocator *)0x0;
  do {
    this = local_10;
    __fd_00 = std::__cxx11::string::operator[]((ulong)this_00);
    sVar1 = fmt::v5::file::read(this,__fd_00,local_18 + -(long)local_40,(size_t)__nbytes_00);
    __nbytes_00 = local_40 + sVar1;
    local_79 = __nbytes_00 < local_18 && sVar1 != 0;
    local_40 = __nbytes_00;
  } while (local_79);
  std::__cxx11::string::resize((ulong)this_00);
  return (ssize_t)this_00;
}

Assistant:

std::string read(file &f, std::size_t count) {
  std::string buffer(count, '\0');
  std::size_t n = 0, offset = 0;
  do {
    n = f.read(&buffer[offset], count - offset);
    // We can't read more than size_t bytes since count has type size_t.
    offset += n;
  } while (offset < count && n != 0);
  buffer.resize(offset);
  return buffer;
}